

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  Fts5Hash *pHash;
  Fts5Data *pFVar1;
  u64 p_00;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  int nList;
  int nTerm;
  char *zTerm;
  u64 iDelta;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (int)pIter->iLeafOffset;
  while ((pIter->pSeg != (Fts5StructureSegment *)0x0 && (pIter->pLeaf->szLeaf <= iVar5))) {
    fts5SegIterNextPage(p,pIter);
    if ((p->rc != 0) || (pIter->pLeaf == (Fts5Data *)0x0)) goto LAB_001cca81;
    pIter->iRowid = 0;
    iVar5 = 4;
  }
  if (iVar5 < pIter->iEndofDoclist) {
    iDelta = (u64)&DAT_aaaaaaaaaaaaaaaa;
    bVar2 = sqlite3Fts5GetVarint(pIter->pLeaf->p + iVar5,&iDelta);
    pIter->iLeafOffset = (long)(int)((uint)bVar2 + iVar5);
    pIter->iRowid = pIter->iRowid + iDelta;
  }
  else {
    if ((pIter->flags & 1) != 0) {
LAB_001cca73:
      sqlite3_free(pIter->pLeaf);
      pIter->pLeaf = (Fts5Data *)0x0;
LAB_001cca81:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_001ccaa0;
    }
    if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
      iDelta = 0;
      zTerm = (char *)0x0;
      nTerm = 0;
      nList = -0x55555556;
      pHash = p->pHash;
      pHash->pScan = pHash->pScan->pScanNext;
      sqlite3Fts5HashScanEntry(pHash,&zTerm,&nTerm,(u8 **)&iDelta,&nList);
      p_00 = iDelta;
      if (iDelta == 0) goto LAB_001cca73;
      pFVar1 = pIter->pLeaf;
      pFVar1->p = (u8 *)iDelta;
      pFVar1->nn = nList;
      pFVar1->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term,nTerm,(u8 *)zTerm);
      bVar2 = sqlite3Fts5GetVarint((uchar *)p_00,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (ulong)bVar2;
    }
    else {
      iDelta = iDelta & 0xffffffff00000000;
      iVar3 = fts5LeafFirstTermOff(pIter->pLeaf);
      iVar4 = 0;
      if (iVar5 != iVar3) {
        iVar4 = sqlite3Fts5GetVarint32(pIter->pLeaf->p + iVar5,(u32 *)&iDelta);
        iVar5 = iVar5 + iVar4;
        iVar4 = (int)iDelta;
      }
      pIter->iLeafOffset = (long)iVar5;
      fts5SegIterLoadTerm(p,pIter,iVar4);
    }
    if (pbNewTerm != (int *)0x0) {
      *pbNewTerm = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    fts5SegIterLoadNPos(p,pIter);
    return;
  }
LAB_001ccaa0:
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  while( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    u64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &nTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, nTerm, (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}